

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elements.c
# Opt level: O3

int wally_asset_value_commitment
              (uint64_t value,uchar *vbf,size_t vbf_len,uchar *generator,size_t generator_len,
              uchar *bytes_out,size_t len)

{
  int iVar1;
  int iVar2;
  secp256k1_context_struct *ctx;
  secp256k1_generator gen;
  secp256k1_pedersen_commitment local_b0;
  secp256k1_generator local_70;
  
  ctx = secp_ctx();
  if (ctx == (secp256k1_context_struct *)0x0) {
    iVar2 = -3;
  }
  else {
    iVar2 = -2;
    if ((len == 0x21 && ((bytes_out != (uchar *)0x0 && vbf != (uchar *)0x0) && vbf_len == 0x20)) &&
       (generator_len == 0x21 && generator != (uchar *)0x0)) {
      iVar1 = secp256k1_generator_parse(ctx,&local_70,generator);
      if (iVar1 != 0) {
        iVar2 = secp256k1_pedersen_commit(ctx,&local_b0,vbf,value,&local_70);
        if (iVar2 == 0) {
          iVar2 = -2;
        }
        else {
          iVar2 = secp256k1_pedersen_commitment_serialize(ctx,bytes_out,&local_b0);
          iVar2 = (uint)(iVar2 != 0) * 2 + -2;
        }
        wally_clear_2(&local_70,0x40,&local_b0,0x40);
      }
    }
  }
  return iVar2;
}

Assistant:

int wally_asset_value_commitment(uint64_t value,
                                 const unsigned char *vbf, size_t vbf_len,
                                 const unsigned char *generator, size_t generator_len,
                                 unsigned char *bytes_out, size_t len)
{
    const secp256k1_context *ctx = secp_ctx();
    secp256k1_generator gen;
    secp256k1_pedersen_commitment commit;
    bool ok;

    if (!ctx)
        return WALLY_ENOMEM;

    if (!vbf || vbf_len != ASSET_TAG_LEN || !bytes_out || len != ASSET_COMMITMENT_LEN ||
        get_generator(ctx, generator, generator_len, &gen) != WALLY_OK)
        return WALLY_EINVAL;

    ok = secp256k1_pedersen_commit(ctx, &commit, vbf, value, &gen) &&
         secp256k1_pedersen_commitment_serialize(ctx, bytes_out, &commit);

    wally_clear_2(&gen, sizeof(gen), &commit, sizeof(commit));
    return ok ? WALLY_OK : WALLY_EINVAL;
}